

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

put_transaction<density_tests::Derived1> * __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::start_emplace<density_tests::Derived1>
          (put_transaction<density_tests::Derived1> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          *this)

{
  void *pvVar1;
  Allocation push_data;
  Allocation local_50;
  put_transaction<density_tests::Derived1> local_38;
  
  detail::
  LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            (&local_50,
             (LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              *)this,1,true,0x40,0x10);
  pvVar1 = local_50.m_user_storage;
  local_50.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::Derived1>
       ::s_table;
  *(undefined8 *)((long)local_50.m_user_storage + 0x20) = 0;
  *(undefined8 *)((long)local_50.m_user_storage + 0x28) = 0;
  *(undefined8 *)((long)local_50.m_user_storage + 0x30) = 0;
  *(undefined8 *)((long)local_50.m_user_storage + 0x38) = 0;
  *(undefined8 *)((long)local_50.m_user_storage + 0x10) = 0;
  *(undefined8 *)((long)local_50.m_user_storage + 0x18) = 0;
  *(undefined8 *)local_50.m_user_storage = 0;
  *(undefined8 *)((long)local_50.m_user_storage + 8) = 0;
  *(undefined4 *)((long)local_50.m_user_storage + 0x20) = 0x23;
  density_tests::InstanceCounted::new_instance
            ((InstanceCounted *)((long)local_50.m_user_storage + 0x24));
  *(undefined ***)((long)pvVar1 + 0x18) = &PTR_class_id_01067338;
  *(undefined8 *)((long)pvVar1 + 0x28) = 0x4036000000000000;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)pvVar1 + 0x30));
  *(undefined8 *)pvVar1 = 0x1067470;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0x10674a8;
  *(undefined8 *)((long)pvVar1 + 8) = 999;
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)pvVar1 + 0x10));
  local_38.m_put.m_control_block = local_50.m_control_block;
  local_38.m_put.m_next_ptr = local_50.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_50.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_50.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_50.m_next_ptr;
  __return_storage_ptr__->m_queue = this;
  local_38.m_put.m_user_storage = (void *)0x0;
  local_38.m_queue = this;
  put_transaction<density_tests::Derived1>::~put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();

                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }